

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O1

RK_S32 vp9_parser_frame(Vp9CodecContext *ctx,HalDecTask *task)

{
  VP9Context *s;
  void *pvVar1;
  RK_S32 RVar2;
  int iVar3;
  RockchipSocType RVar4;
  RK_U8 *data;
  size_t sVar5;
  RK_S64 RVar6;
  RefInfo *pRVar7;
  ulong uVar8;
  VP9Context *pVVar9;
  code *val;
  VP9Context *pVVar10;
  int iVar11;
  RK_U32 RVar12;
  MppFrameFormat v;
  VP9Context *pVVar13;
  long lVar14;
  VP9Context *pVVar15;
  long lVar16;
  long lVar17;
  VP9Frame *pVVar18;
  byte bVar19;
  long lVar20;
  bool bVar21;
  RK_S32 ref;
  MppFrame frame;
  RK_S32 local_44;
  VP9Frame *local_40;
  MppFrame local_38;
  
  s = (VP9Context *)ctx->priv_data;
  local_44 = 0;
  if (((byte)vp9d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"%s",(char *)0x0);
  }
  task->valid = 0xffffffff;
  data = (RK_U8 *)mpp_packet_get_pos(ctx->pkt);
  sVar5 = mpp_packet_get_length(ctx->pkt);
  iVar11 = (int)sVar5;
  RVar6 = mpp_packet_get_pts(ctx->pkt);
  s->pts = RVar6;
  if (((byte)vp9d_debug & 2) != 0) {
    _mpp_log_l(4,(char *)0x0,"data size %d",(char *)0x0);
  }
  if (0 < iVar11) {
    RVar2 = decode_parser_header(ctx,data,iVar11,&local_44);
    if (RVar2 < 0) {
      return RVar2;
    }
    if (RVar2 == 0) {
      lVar20 = (long)local_44;
      if (s->refs[lVar20].ref != (RefInfo *)0x0) {
        local_38 = (MppFrame)0x0;
        mpp_buf_slot_get_prop(s->slots,s->refs[lVar20].slot_index,SLOT_FRAME_PTR,&local_38);
        mpp_frame_set_pts(local_38,s->pts);
        mpp_buf_slot_set_flag(s->slots,s->refs[lVar20].slot_index,SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(s->slots,s->refs[lVar20].slot_index,QUEUE_DISPLAY);
        (s->refs[lVar20].ref)->is_output = 1;
        s->outframe_num = s->outframe_num + 1;
        _mpp_log_l(4,(char *)0x0,"out repeat num %d",(char *)0x0);
        return iVar11;
      }
      return -1;
    }
    if (s->frames[1].ref != (RefInfo *)0x0) {
      vp9_unref_frame(s,s->frames + 1);
    }
    local_40 = s->frames;
    if ((((s->intraonly == '\0') && (s->keyframe == '\0')) && (s->errorres == '\0')) &&
       ((s->frames[0].ref != (RefInfo *)0x0 &&
        (RVar2 = vp9_ref_frame(ctx,s->frames + 1,local_40), RVar2 < 0)))) {
      return RVar2;
    }
    pVVar18 = local_40;
    if (s->frames[0].ref != (RefInfo *)0x0) {
      vp9_unref_frame(s,local_40);
    }
    pvVar1 = ctx->priv_data;
    mpp_frame_set_width(pVVar18->f,ctx->width);
    mpp_frame_set_height(pVVar18->f,ctx->height);
    iVar3 = (uint)*(byte *)((long)pvVar1 + 0xd4) * ctx->width;
    iVar11 = iVar3 + 7;
    if (-1 < iVar3) {
      iVar11 = iVar3;
    }
    mpp_frame_set_hor_stride(pVVar18->f,iVar11 >> 3);
    mpp_frame_set_ver_stride(pVVar18->f,ctx->height);
    mpp_frame_set_errinfo(pVVar18->f,0);
    mpp_frame_set_discard(pVVar18->f,0);
    mpp_frame_set_pts(pVVar18->f,*(RK_S64 *)((long)pvVar1 + 0x70d8));
    RVar12 = *(int *)((long)pvVar1 + 0x70e8) + 1;
    *(RK_U32 *)((long)pvVar1 + 0x70e8) = RVar12;
    mpp_frame_set_poc(pVVar18->f,RVar12);
    if ((*(byte *)(*(long *)((long)pvVar1 + 0x70b8) + 0x1a) & 0xf0) == 0) {
      RVar4 = mpp_get_soc_type();
      if (RVar4 == ROCKCHIP_SOC_RK3576) {
        val = mpp_align_128_odd_plus_64;
      }
      else {
        val = mpp_align_256_odd;
      }
      mpp_slots_set_prop(*(MppBufSlots *)((long)pvVar1 + 0x70a8),SLOTS_HOR_ALIGN,val);
      mpp_slots_set_prop(*(MppBufSlots *)((long)pvVar1 + 0x70a8),SLOTS_VER_ALIGN,mpp_align_64);
      v = ctx->pix_fmt;
      if ((*(byte *)(*(long *)((long)pvVar1 + 0x70b8) + 0x1b) & 2) != 0) {
        v = v | 0x2000000;
      }
      mpp_frame_set_fmt(pVVar18->f,v);
    }
    else {
      RVar12 = mpp_align_64(ctx->width);
      mpp_slots_set_prop(*(MppBufSlots *)((long)pvVar1 + 0x70a8),SLOTS_HOR_ALIGN,mpp_align_64);
      mpp_frame_set_fmt(pVVar18->f,
                        *(MppFrameFormat *)(*(long *)((long)pvVar1 + 0x70b8) + 0x18) & 0xf00000 |
                        ctx->pix_fmt);
      if (*compat_ext_fbc_hdr_256_odd != 0) {
        RVar12 = mpp_align_256_odd(ctx->width);
      }
      mpp_frame_set_fbc_hdr_stride(pVVar18->f,RVar12);
    }
    RVar12 = *(RK_U32 *)(*(long *)((long)pvVar1 + 0x70b8) + 0x40);
    if ((RVar12 == 0) || ((*(byte *)(*(long *)((long)pvVar1 + 0x70c0) + 6) & 8) == 0)) {
      RVar12 = 0;
    }
    mpp_frame_set_thumbnail_en(s->frames[0].f,RVar12);
    mpp_buf_slot_get_unused(*(MppBufSlots *)((long)pvVar1 + 0x70a8),&s->frames[0].slot_index);
    mpp_buf_slot_set_prop
              (*(MppBufSlots *)((long)pvVar1 + 0x70a8),s->frames[0].slot_index,SLOT_FRAME,
               s->frames[0].f);
    mpp_buf_slot_set_flag
              (*(MppBufSlots *)((long)pvVar1 + 0x70a8),s->frames[0].slot_index,SLOT_CODEC_USE);
    mpp_buf_slot_set_flag
              (*(MppBufSlots *)((long)pvVar1 + 0x70a8),s->frames[0].slot_index,SLOT_HAL_OUTPUT);
    pRVar7 = (RefInfo *)mpp_osal_calloc("vp9_alloc_frame",0x10);
    s->frames[0].ref = pRVar7;
    pRVar7->ref_count = pRVar7->ref_count + 1;
    pRVar7->invisible = (uint)*(byte *)((long)pvVar1 + 0xd7);
    pRVar7->is_output = 0;
    if ((s->refreshctx != '\0') && (s->parallelmode != '\0')) {
      uVar8 = 0;
      pVVar9 = s;
      do {
        pVVar10 = pVVar9;
        lVar20 = 0;
        do {
          pVVar13 = pVVar10;
          lVar14 = 0;
          do {
            lVar16 = 0;
            pVVar15 = pVVar13;
            do {
              lVar17 = -0x12;
              do {
                bVar19 = s->framectxid;
                *(undefined1 *)((long)pVVar15->prob_ctx[bVar19].coef[0][0][0][1][0] + lVar17 + 2U) =
                     *(undefined1 *)((long)(pVVar15->prob).coef[0][0][0][1][0] + lVar17 + 2U);
                *(undefined2 *)((long)pVVar15->prob_ctx[bVar19].coef[0][0][0][1][0] + lVar17) =
                     *(undefined2 *)((long)(pVVar15->prob).coef[0][0][0][1][0] + lVar17);
                lVar17 = lVar17 + 3;
              } while (lVar17 != 0);
              lVar16 = lVar16 + 1;
              pVVar15 = (VP9Context *)((long)&(pVVar15->gb).curr_byte_ + 2);
            } while (lVar16 != 6);
            pVVar13 = (VP9Context *)((long)&(pVVar13->c).end + 4);
            bVar21 = lVar14 == 0;
            lVar14 = lVar14 + 1;
          } while (bVar21);
          pVVar10 = (VP9Context *)&pVVar10->use_last_frame_mvs;
          bVar21 = lVar20 == 0;
          lVar20 = lVar20 + 1;
        } while (bVar21);
        if (uVar8 == s->txfmmode) break;
        uVar8 = uVar8 + 1;
        pVVar9 = (VP9Context *)&pVVar9->refs[4].ref;
      } while (uVar8 != 4);
      memcpy(s->prob_ctx + s->framectxid,&s->prob,0x137);
    }
    vp9d_parser2_syntax(ctx);
    (task->syntax).data = &ctx->pic_params;
    (task->syntax).number = 1;
    task->valid = 1;
    task->output = s->frames[0].slot_index;
    task->input_packet = ctx->pkt;
    pVVar18 = s->refs;
    lVar20 = 0;
    do {
      if (s->refs[s->refidx[lVar20]].slot_index < 0x7f) {
        local_38 = (MppFrame)0x0;
        mpp_buf_slot_set_flag(s->slots,s->refs[s->refidx[lVar20]].slot_index,SLOT_HAL_INPUT);
        RVar2 = s->refs[s->refidx[lVar20]].slot_index;
        task->refer[lVar20] = RVar2;
        mpp_buf_slot_get_prop(s->slots,RVar2,SLOT_FRAME_PTR,&local_38);
        if (((local_38 != (MppFrame)0x0) && (s->keyframe == '\0')) && (s->intraonly == '\0')) {
          RVar12 = mpp_frame_get_errinfo(local_38);
          (task->flags).val =
               (task->flags).val & 0xfffffffffffffff7 |
               (ulong)((RVar12 << 3 | (uint)(task->flags).val) & 8);
        }
      }
      else {
        task->refer[lVar20] = -1;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    if (((byte)vp9d_debug & 4) != 0) {
      _mpp_log_l(4,(char *)0x0,"ref_errinfo=%d\n",(char *)0x0,
                 (ulong)(*(uint *)&task->flags >> 3 & 1));
    }
    if (s->eos != 0) {
      *(byte *)&task->flags = *(byte *)&task->flags | 1;
    }
    if (s->invisible == '\0') {
      mpp_buf_slot_set_flag(s->slots,s->frames[0].slot_index,SLOT_QUEUE_USE);
      mpp_buf_slot_enqueue(s->slots,s->frames[0].slot_index,QUEUE_DISPLAY);
    }
    if (((byte)vp9d_debug & 4) != 0) {
      _mpp_log_l(4,(char *)0x0,"s->refreshrefmask = %d s->frames[CUR_FRAME] = %d",(char *)0x0,
                 (ulong)s->refreshrefmask,(ulong)(uint)s->frames[0].slot_index);
    }
    lVar20 = 0xed;
    do {
      bVar19 = *(byte *)((long)&(s->gb).data_ + lVar20);
      if ((s->refs[bVar19].ref != (RefInfo *)0x0) && (((byte)vp9d_debug & 4) != 0)) {
        _mpp_log_l(4,(char *)0x0,"ref buf select %d",(char *)0x0,
                   (ulong)(uint)pVVar18[bVar19].slot_index);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0xf0);
    uVar8 = 0;
    do {
      if (((byte)vp9d_debug & 4) != 0) {
        _mpp_log_l(4,(char *)0x0,"s->refreshrefmask = 0x%x",(char *)0x0,(ulong)s->refreshrefmask);
      }
      if ((s->refreshrefmask >> ((uint)uVar8 & 0x1f) & 1) == 0) {
        bVar19 = 0;
      }
      else {
        if (pVVar18->ref != (RefInfo *)0x0) {
          vp9_unref_frame(s,pVVar18);
        }
        if (((byte)vp9d_debug & 4) != 0) {
          _mpp_log_l(4,(char *)0x0,"update ref index in %d",(char *)0x0,uVar8 & 0xffffffff);
        }
        RVar2 = vp9_ref_frame(ctx,pVVar18,local_40);
        bVar19 = (byte)((uint)RVar2 >> 0x1f);
      }
      if ((pVVar18->ref != (RefInfo *)0x0) && (((byte)vp9d_debug & 4) != 0)) {
        _mpp_log_l(4,(char *)0x0,"s->refs[%d] = %d",(char *)0x0,uVar8 & 0xffffffff,
                   (ulong)(uint)pVVar18->slot_index);
      }
      bVar21 = uVar8 == 7;
      uVar8 = uVar8 + 1;
      pVVar18 = pVVar18 + 1;
    } while ((bVar19 | bVar21) != 1);
  }
  return 0;
}

Assistant:

RK_S32 vp9_parser_frame(Vp9CodecContext *ctx, HalDecTask *task)
{

    const RK_U8 *data = NULL;
    RK_S32 size = 0;
    VP9Context *s = (VP9Context *)ctx->priv_data;
    RK_S32 res, i, ref = 0;

    vp9d_dbg(VP9D_DBG_FUNCTION, "%s", __FUNCTION__);
    task->valid = -1;
#ifdef dump
    dec_num++;
#endif
    data = (const RK_U8 *)mpp_packet_get_pos(ctx->pkt);
    size = (RK_S32)mpp_packet_get_length(ctx->pkt);

    s->pts = mpp_packet_get_pts(ctx->pkt);

    vp9d_dbg(VP9D_DBG_HEADER, "data size %d", size);
    if (size <= 0) {
        return MPP_OK;
    }
    if ((res = decode_parser_header(ctx, data, size, &ref)) < 0) {
        return res;
    } else if (res == 0) {
        if (!s->refs[ref].ref) {
            //mpp_err("Requested reference %d not available\n", ref);
            return -1;//AVERROR_INVALIDDATA;
        }
        {
            MppFrame frame = NULL;

            mpp_buf_slot_get_prop(s->slots, s->refs[ref].slot_index, SLOT_FRAME_PTR, &frame);
            mpp_frame_set_pts(frame, s->pts);
            mpp_buf_slot_set_flag(s->slots, s->refs[ref].slot_index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(s->slots, s->refs[ref].slot_index, QUEUE_DISPLAY);
            s->refs[ref].ref->is_output = 1;
        }

        mpp_log("out repeat num %d", s->outframe_num++);
        return size;
    }
    data += res;
    size -= res;

    if (s->frames[REF_FRAME_MVPAIR].ref)
        vp9_unref_frame(s, &s->frames[REF_FRAME_MVPAIR]);

    if (!s->intraonly && !s->keyframe && !s->errorres && s->frames[CUR_FRAME].ref) {
        if ((res = vp9_ref_frame(ctx, &s->frames[REF_FRAME_MVPAIR], &s->frames[CUR_FRAME])) < 0)
            return res;
    }

    if (s->frames[CUR_FRAME].ref)
        vp9_unref_frame(s, &s->frames[CUR_FRAME]);

    if ((res = vp9_alloc_frame(ctx, &s->frames[CUR_FRAME])) < 0)
        return res;

    if (s->refreshctx && s->parallelmode) {
        RK_S32 j, k, l, m;

        for (i = 0; i < 4; i++) {
            for (j = 0; j < 2; j++)
                for (k = 0; k < 2; k++)
                    for (l = 0; l < 6; l++)
                        for (m = 0; m < 6; m++)
                            memcpy(s->prob_ctx[s->framectxid].coef[i][j][k][l][m],
                                   s->prob.coef[i][j][k][l][m], 3);
            if ((RK_S32)s->txfmmode == i)
                break;
        }
        s->prob_ctx[s->framectxid].p = s->prob.p;
    }

    vp9d_parser2_syntax(ctx);

    task->syntax.data = (void*)&ctx->pic_params;
    task->syntax.number = 1;
    task->valid = 1;
    task->output = s->frames[CUR_FRAME].slot_index;
    task->input_packet = ctx->pkt;

    for (i = 0; i < 3; i++) {
        if (s->refs[s->refidx[i]].slot_index < 0x7f) {
            MppFrame mframe = NULL;
            mpp_buf_slot_set_flag(s->slots, s->refs[s->refidx[i]].slot_index, SLOT_HAL_INPUT);
            task->refer[i] = s->refs[s->refidx[i]].slot_index;
            mpp_buf_slot_get_prop(s->slots, task->refer[i], SLOT_FRAME_PTR, &mframe);
            if (mframe && !s->keyframe && !s->intraonly)
                task->flags.ref_err |= mpp_frame_get_errinfo(mframe);
        } else {
            task->refer[i] = -1;
        }
    }

    vp9d_dbg(VP9D_DBG_REF, "ref_errinfo=%d\n", task->flags.ref_err);
    if (s->eos) {
        task->flags.eos = 1;
    }

    if (!s->invisible) {
        mpp_buf_slot_set_flag(s->slots,  s->frames[CUR_FRAME].slot_index, SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(s->slots, s->frames[CUR_FRAME].slot_index, QUEUE_DISPLAY);
    }
    vp9d_dbg(VP9D_DBG_REF, "s->refreshrefmask = %d s->frames[CUR_FRAME] = %d",
             s->refreshrefmask, s->frames[CUR_FRAME].slot_index);
    for (i = 0; i < 3; i++) {
        if (s->refs[s->refidx[i]].ref != NULL) {
            vp9d_dbg(VP9D_DBG_REF, "ref buf select %d", s->refs[s->refidx[i]].slot_index);
        }
    }
    // ref frame setup
    for (i = 0; i < 8; i++) {
        vp9d_dbg(VP9D_DBG_REF, "s->refreshrefmask = 0x%x", s->refreshrefmask);
        res = 0;
        if (s->refreshrefmask & (1 << i)) {
            if (s->refs[i].ref)
                vp9_unref_frame(s, &s->refs[i]);
            vp9d_dbg(VP9D_DBG_REF, "update ref index in %d", i);
            res = vp9_ref_frame(ctx, &s->refs[i], &s->frames[CUR_FRAME]);
        }

        if (s->refs[i].ref)
            vp9d_dbg(VP9D_DBG_REF, "s->refs[%d] = %d", i, s->refs[i].slot_index);
        if (res < 0)
            return 0;
    }
    return 0;
}